

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::ParseableFunctionInfo::SetDeferredParsingEntryPoint(ParseableFunctionInfo *this)

{
  JavascriptMethod p_Var1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  p_Var1 = ((this->super_FunctionProxy).m_scriptContext)->DeferredParsingThunk;
  if (p_Var1 != JavascriptFunction::DeferredParsingThunk &&
      p_Var1 != ScriptContext::ProfileModeDeferredParsingThunk) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xeb8,
                                "(m_scriptContext->DeferredParsingThunk == Js::ScriptContext::ProfileModeDeferredParsingThunk || m_scriptContext->DeferredParsingThunk == Js::JavascriptFunction::DeferredParsingThunk)"
                                ,
                                "m_scriptContext->DeferredParsingThunk == ProfileDeferredParsingThunk || m_scriptContext->DeferredParsingThunk == DefaultDeferredParsingThunk"
                               );
    if (!bVar3) goto LAB_0077059e;
    *puVar4 = 0;
  }
  ((this->super_FunctionProxy).m_defaultEntryPointInfo.ptr)->jsMethod =
       (Type)((this->super_FunctionProxy).m_scriptContext)->DeferredParsingThunk;
  if ((this->super_FunctionProxy).functionInfo.ptr == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4e3,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_0077059e;
    *puVar4 = 0;
  }
  if ((ParseableFunctionInfo *)
      (((this->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4e4,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar3) {
LAB_0077059e:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  FunctionInfo::SetOriginalEntryPoint
            ((this->super_FunctionProxy).functionInfo.ptr,JavascriptFunction::DeferredParsingThunk);
  return;
}

Assistant:

void ParseableFunctionInfo::SetDeferredParsingEntryPoint()
    {
#if defined(ENABLE_SCRIPT_PROFILING) || defined(ENABLE_SCRIPT_DEBUGGING)
        Assert(m_scriptContext->DeferredParsingThunk == ProfileDeferredParsingThunk
            || m_scriptContext->DeferredParsingThunk == DefaultDeferredParsingThunk);
#else
        Assert(m_scriptContext->DeferredParsingThunk == DefaultDeferredParsingThunk);
#endif

        this->SetEntryPoint(this->GetDefaultEntryPointInfo(), m_scriptContext->DeferredParsingThunk);
        this->SetOriginalEntryPoint(DefaultDeferredParsingThunk);
    }